

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_set_features(lysp_module *pmod,char **features)

{
  char *pcVar1;
  bool bVar2;
  ushort uVar3;
  uint in_EAX;
  int iVar4;
  size_t len;
  lysp_feature *plVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uStack_38;
  uint32_t i;
  
  uStack_38 = (ulong)in_EAX;
  if (features != (char **)0x0) {
    pcVar1 = *features;
    if (pcVar1 == (char *)0x0) {
      plVar5 = (lysp_feature *)0x0;
      bVar2 = false;
      while (plVar5 = lysp_feature_next(plVar5,pmod,&i), plVar5 != (lysp_feature *)0x0) {
        if ((plVar5->flags & 0x20) != 0) {
          plVar5->flags = plVar5->flags & 0xffdf;
          bVar2 = true;
        }
      }
    }
    else if ((*pcVar1 == '*') && (pcVar1[1] == '\0')) {
      plVar5 = (lysp_feature *)0x0;
      bVar2 = false;
      while (plVar5 = lysp_feature_next(plVar5,pmod,&i), plVar5 != (lysp_feature *)0x0) {
        if ((plVar5->flags & 0x20) == 0) {
          plVar5->flags = plVar5->flags | 0x20;
          bVar2 = true;
        }
      }
    }
    else {
      uVar7 = 0;
      while (uVar6 = uVar7, pcVar1 = features[uVar6], pcVar1 != (char *)0x0) {
        len = strlen(pcVar1);
        plVar5 = lysp_feature_find(pmod,pcVar1,len,'\0');
        uVar7 = (ulong)((int)uVar6 + 1);
        if (plVar5 == (lysp_feature *)0x0) {
          ly_log(pmod->mod->ctx,LY_LLERR,LY_EINVAL,"Feature \"%s\" not found in module \"%s\".",
                 features[uVar6],pmod->mod->name);
          return LY_EINVAL;
        }
      }
      bVar2 = false;
      plVar5 = (lysp_feature *)0x0;
LAB_00150cfc:
      plVar5 = lysp_feature_next(plVar5,pmod,&i);
      if (plVar5 != (lysp_feature *)0x0) {
        uVar7 = 0;
        do {
          if (features[uVar7] == (char *)0x0) {
            if ((plVar5->flags & 0x20) == 0) goto LAB_00150cfc;
            uVar3 = plVar5->flags & 0xffdf;
            goto LAB_00150d4c;
          }
          iVar4 = strcmp(plVar5->name,features[uVar7]);
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (iVar4 != 0);
        if ((plVar5->flags & 0x20) == 0) {
          uVar3 = plVar5->flags | 0x20;
LAB_00150d4c:
          plVar5->flags = uVar3;
          bVar2 = true;
        }
        goto LAB_00150cfc;
      }
    }
    if (bVar2) {
      return LY_SUCCESS;
    }
  }
  return LY_EEXIST;
}

Assistant:

LY_ERR
lys_set_features(struct lysp_module *pmod, const char **features)
{
    uint32_t i = 0, j;
    struct lysp_feature *f = 0;
    ly_bool change = 0;

    if (!features) {
        /* do not touch the features */

    } else if (!features[0]) {
        /* disable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (f->flags & LYS_FENABLED) {
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    } else if (!strcmp(features[0], "*")) {
        /* enable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (!(f->flags & LYS_FENABLED)) {
                f->flags |= LYS_FENABLED;
                change = 1;
            }
        }
    } else {
        /* check that all the features exist */
        for (j = 0; features[j]; ++j) {
            if (!lysp_feature_find(pmod, features[j], strlen(features[j]), 0)) {
                LOGERR(pmod->mod->ctx, LY_EINVAL, "Feature \"%s\" not found in module \"%s\".", features[j], pmod->mod->name);
                return LY_EINVAL;
            }
        }

        /* enable specific features, disable the rest */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            for (j = 0; features[j]; ++j) {
                if (!strcmp(f->name, features[j])) {
                    break;
                }
            }

            if (features[j] && !(f->flags & LYS_FENABLED)) {
                /* enable */
                f->flags |= LYS_FENABLED;
                change = 1;
            } else if (!features[j] && (f->flags & LYS_FENABLED)) {
                /* disable */
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    }

    if (!change) {
        /* features already set correctly */
        return LY_EEXIST;
    }

    return LY_SUCCESS;
}